

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:63:7),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:65:10)>
::getImpl(TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_test_c__:63:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_test_c__:65:10)>
          *this,ExceptionOrValue *output)

{
  undefined8 uVar1;
  DebugComparison<kj::Exception::Type,_kj::Exception::Type> _kjCondition;
  Type local_398 [2];
  ExceptionOr<kj::_::Void> local_390;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_> depResult;
  
  depResult.super_ExceptionOrValue.exception.ptr.isSet = false;
  depResult.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&depResult.super_ExceptionOrValue);
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    _kjCondition.left = UNIMPLEMENTED;
    _kjCondition.right = depResult.super_ExceptionOrValue.exception.ptr.field_1.value.type;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.type == UNIMPLEMENTED;
    if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
      local_398[1] = 3;
      local_398[0] = depResult.super_ExceptionOrValue.exception.ptr.field_1.value.type;
      Debug::
      log<char_const(&)[71],kj::_::DebugComparison<kj::Exception::Type,kj::Exception::Type>&,kj::Exception::Type,kj::Exception::Type>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x42,ERROR,
                 "\"failed: expected \" \"(kj::Exception::Type::UNIMPLEMENTED) == (e.getType())\", _kjCondition, kj::Exception::Type::UNIMPLEMENTED, e.getType()"
                 ,(char (*) [71])
                  "failed: expected (kj::Exception::Type::UNIMPLEMENTED) == (e.getType())",
                 &_kjCondition,local_398 + 1,local_398);
    }
    *(this->errorHandler).barFailed = true;
    local_390.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_390.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_390);
  }
  else {
    if (depResult.value.ptr.isSet != true) goto LAB_0017267f;
    _kjCondition.op.content.ptr =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
    ;
    _kjCondition.op.content.size_ = CONCAT44(_kjCondition.op.content.size_._4_4_,0x40);
    _kjCondition.left = CONCAT31(_kjCondition.left._1_3_,1);
    Debug::log<char_const(&)[19],char_const(&)[29]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x40,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
               (char (*) [29])"Expected bar() call to fail.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_kjCondition);
    local_390.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_390.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_390);
  }
  if (local_390.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_390.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_0017267f:
  uVar1 = depResult.value.ptr.field_1.value.hook.ptr;
  if ((depResult.value.ptr.isSet == true) &&
     (depResult.value.ptr.field_1.value.hook.ptr != (ResponseHook *)0x0)) {
    depResult.value.ptr.field_1.value.hook.ptr = (ResponseHook *)0x0;
    (**(depResult.value.ptr.field_1.value.hook.disposer)->_vptr_Disposer)
              (depResult.value.ptr.field_1.value.hook.disposer,
               (_func_int *)
               ((long)&((ResponseHook *)uVar1)->_vptr_ResponseHook +
               (long)((ResponseHook *)uVar1)->_vptr_ResponseHook[-2]));
  }
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&depResult.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    // Derive return type from DepT to reduce templating.
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = handle<T>(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(depException)));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }